

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fortran_array_view.cpp
# Opt level: O0

double __thiscall
cpp_bindgen::adltest::(anonymous_namespace)::StaticHypercube<4ul>::operator()
          (StaticHypercube<4ul> *this,int indices,int indices_1,int indices_2,int indices_3)

{
  out_of_range *this_00;
  ulong local_58;
  size_t i;
  size_t index;
  size_t element [4];
  int indices_local_3;
  int indices_local_2;
  int indices_local_1;
  int indices_local;
  StaticHypercube<4UL> *this_local;
  
  element[0] = (long)indices_1;
  element[1] = (long)indices_2;
  element[2] = (long)indices_3;
  i = 0;
  local_58 = 0;
  while( true ) {
    if (3 < local_58) {
      return *(double *)(*(long *)this + i * 8);
    }
    if (1 < element[local_58 - 1]) break;
    i = (element[local_58 - 1] << (3U - (char)local_58 & 0x3f)) + i;
    local_58 = local_58 + 1;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"Index out of range");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

double operator()(Ts... indices) const {
                    size_t element[Rank] = {size_t(indices)...};
                    size_t index = 0;
                    for (size_t i = 0; i < Rank; ++i) {
                        if (element[i] >= 2) {
                            throw std::out_of_range("Index out of range");
                        }
                        index += (element[i] << (Rank - i - 1));
                    }
                    return data_[index];
                }